

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O1

void vkt::pipeline::anon_unknown_0::initPrograms
               (SourceCollections *programCollection,CaseDef_conflict *caseDef)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  TextureFormat TVar4;
  char *pcVar5;
  size_t sVar6;
  ProgramSources *pPVar7;
  long *plVar8;
  undefined8 *puVar9;
  ostream *poVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long *plVar12;
  undefined8 uVar13;
  pointer pcVar14;
  char *pcVar15;
  string colorFormat;
  string colorInteger;
  ostringstream src;
  ostringstream colorValue;
  undefined1 auStack_3d8 [8];
  undefined1 local_3d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  pointer *local_3a8;
  long local_3a0;
  pointer local_398 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  long *local_348;
  long local_340;
  long local_338;
  long lStack_330;
  SourceCollections *local_328;
  long *local_320;
  undefined8 local_318;
  long local_310;
  undefined8 uStack_308;
  ios_base local_2b0 [264];
  uint local_1a8 [2];
  value_type local_1a0 [3];
  ios_base local_138 [264];
  
  TVar4 = ::vk::mapVkFormat(caseDef->colorFormat);
  iVar3 = tcu::getNumUsedChannels(TVar4.order);
  bVar1 = ::vk::isUintFormat(caseDef->colorFormat);
  bVar2 = ::vk::isIntFormat(caseDef->colorFormat);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)auStack_3d8 + (int)local_320[-3] + 0xb8);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"layout(location = 0) in  vec4 in_position;\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"layout(location = 1) in  vec4 in_color;\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"layout(location = 0) out vec4 out_color;\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"out gl_PerVertex {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"\tvec4 gl_Position;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"};\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"void main(void)\n",0x10)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"\tgl_Position\t= in_position;\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"\tout_color\t= in_color;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"}\n",2);
  local_3d0._0_8_ = &local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"vert","");
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)local_3d0);
  local_328 = programCollection;
  std::__cxx11::stringbuf::str();
  local_1a8[0] = 0;
  local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,local_388._M_dataplus._M_p,
             local_388._M_dataplus._M_p + local_388._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar7->sources + local_1a8[0],local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._0_8_ != &local_3c0) {
    operator_delete((void *)local_3d0._0_8_,local_3c0._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<((ostringstream *)local_1a8,0x7d);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
  if (iVar3 == 1) {
    pcVar5 = "float";
    if (bVar2) {
      pcVar5 = "int";
    }
    pcVar15 = "uint";
    if (!bVar1) {
      pcVar15 = pcVar5;
    }
    sVar6 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,pcVar15,sVar6);
  }
  else {
    pcVar5 = "";
    if (bVar2) {
      pcVar5 = "i";
    }
    pcVar15 = "u";
    if (!bVar1) {
      pcVar15 = pcVar5;
    }
    sVar6 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,pcVar15,sVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"vec",3);
    std::ostream::operator<<(&local_320,iVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
  std::ios_base::~ios_base(local_2b0);
  if (!bVar1 && !bVar2) {
    local_348 = &local_338;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"");
    goto LAB_005038ad;
  }
  std::operator+(&local_368," * ",&local_388);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_368);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar11) {
    local_3c0._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_3c0._8_8_ = plVar8[3];
    local_3d0._0_8_ = &local_3c0;
  }
  else {
    local_3c0._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_3d0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar8;
  }
  local_3d0._8_8_ = plVar8[1];
  *plVar8 = (long)paVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::stringbuf::str();
  uVar13 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._0_8_ != &local_3c0) {
    uVar13 = local_3c0._M_allocated_capacity;
  }
  if ((ulong)uVar13 < (pointer)(local_3d0._8_8_ + local_3a0)) {
    pcVar14 = (pointer)0xf;
    if (local_3a8 != local_398) {
      pcVar14 = local_398[0];
    }
    if (pcVar14 < (pointer)(local_3d0._8_8_ + local_3a0)) goto LAB_00503762;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3a8,0,(char *)0x0,local_3d0._0_8_);
  }
  else {
LAB_00503762:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append(local_3d0,(ulong)local_3a8);
  }
  local_320 = &local_310;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_310 = *plVar8;
    uStack_308 = puVar9[3];
  }
  else {
    local_310 = *plVar8;
    local_320 = (long *)*puVar9;
  }
  local_318 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_320);
  local_348 = &local_338;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_338 = *plVar12;
    lStack_330 = plVar8[3];
  }
  else {
    local_338 = *plVar12;
    local_348 = (long *)*plVar8;
  }
  local_340 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_320 != &local_310) {
    operator_delete(local_320,local_310 + 1);
  }
  if (local_3a8 != local_398) {
    operator_delete(local_3a8,(ulong)(local_398[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._0_8_ != &local_3c0) {
    operator_delete((void *)local_3d0._0_8_,local_3c0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
LAB_005038ad:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)auStack_3d8 + (int)local_320[-3] + 0xb8);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"layout(location = 0) in  vec4 in_color;\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_320,"layout(location = 0) out ",0x19);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_320,local_388._M_dataplus._M_p,local_388._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," o_color;\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"    o_color = ",0xe);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_388._M_dataplus._M_p,local_388._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
  if (iVar3 == 1) {
    pcVar5 = "in_color.r";
  }
  else if (iVar3 == 2) {
    pcVar5 = "in_color.rg";
  }
  else {
    pcVar5 = "in_color";
    if (iVar3 == 3) {
      pcVar5 = "in_color.rgb";
    }
  }
  sVar6 = strlen(pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar5,sVar6);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_348,local_340);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,");\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}\n",2);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"frag","");
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_328->glslSources,&local_368);
  std::__cxx11::stringbuf::str();
  local_3d0._0_4_ = 1;
  local_3d0._8_8_ = local_3c0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_3d0 + 8),local_3a8,local_3a0 + (long)local_3a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar7->sources + (local_3d0._0_8_ & 0xffffffff),(value_type *)(local_3d0 + 8));
  if ((char *)local_3d0._8_8_ != local_3c0._M_local_buf + 8) {
    operator_delete((void *)local_3d0._8_8_,local_3c0._8_8_ + 1);
  }
  if (local_3a8 != local_398) {
    operator_delete(local_3a8,(ulong)(local_398[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
  std::ios_base::~ios_base(local_2b0);
  if (local_348 != &local_338) {
    operator_delete(local_348,local_338 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const CaseDef caseDef)
{
	const int	numComponents	= getNumUsedChannels(mapVkFormat(caseDef.colorFormat).order);
	const bool	isUint			= isUintFormat(caseDef.colorFormat);
	const bool	isSint			= isIntFormat(caseDef.colorFormat);

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_position;\n"
			<< "layout(location = 1) in  vec4 in_color;\n"
			<< "layout(location = 0) out vec4 out_color;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "	vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "	gl_Position	= in_position;\n"
			<< "	out_color	= in_color;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream colorValue;
		colorValue << REFERENCE_COLOR_VALUE;
		const std::string colorFormat	= getColorFormatStr(numComponents, isUint, isSint);
		const std::string colorInteger	= (isUint || isSint ? " * "+colorFormat+"("+colorValue.str()+")" :"");

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color;\n"
			<< "layout(location = 0) out " << colorFormat << " o_color;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    o_color = " << colorFormat << "("
			<< (numComponents == 1 ? "in_color.r"   :
				numComponents == 2 ? "in_color.rg"  :
				numComponents == 3 ? "in_color.rgb" : "in_color")
			<< colorInteger
			<< ");\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}